

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

unsigned_short ncnn::float32_to_float16(float value)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = (uint)value >> 0x1f;
  uVar2 = (uint)value >> 0x17;
  uVar3 = (uint)value & 0x7fffff;
  if ((char)uVar2 == -1) {
    return (short)(uVar1 << 0xf) + (ushort)(uVar3 != 0) * 0x200 + 0x7c00;
  }
  uVar4 = uVar2 & 0xff;
  if (uVar4 != 0) {
    if (0x8e < uVar4) {
      return (ushort)(uVar1 << 0xf) | 0x7c00;
    }
    if (0x70 < uVar4) {
      return (ushort)(uVar3 >> 0xd) | (ushort)(uVar1 << 0xf) | (short)(uVar2 << 10) + 0x4000U;
    }
    if (0x65 < uVar4) {
      return (ushort)(uVar1 << 0xf) | (ushort)((uVar3 | 0x800000) >> (0x7eU - (char)uVar2 & 0x1f));
    }
  }
  return (unsigned_short)(uVar1 << 0xf);
}

Assistant:

unsigned short float32_to_float16(float value)
{
    // 1 : 8 : 23
    union
    {
        unsigned int u;
        float f;
    } tmp;

    tmp.f = value;

    // 1 : 8 : 23
    unsigned short sign = (tmp.u & 0x80000000) >> 31;
    unsigned short exponent = (tmp.u & 0x7F800000) >> 23;
    unsigned int significand = tmp.u & 0x7FFFFF;

    //     NCNN_LOGE("%d %d %d", sign, exponent, significand);

    // 1 : 5 : 10
    unsigned short fp16;
    if (exponent == 0)
    {
        // zero or denormal, always underflow
        fp16 = (sign << 15) | (0x00 << 10) | 0x00;
    }
    else if (exponent == 0xFF)
    {
        // infinity or NaN
        fp16 = (sign << 15) | (0x1F << 10) | (significand ? 0x200 : 0x00);
    }
    else
    {
        // normalized
        short newexp = exponent + (- 127 + 15);
        if (newexp >= 31)
        {
            // overflow, return infinity
            fp16 = (sign << 15) | (0x1F << 10) | 0x00;
        }
        else if (newexp <= 0)
        {
            // underflow
            if (newexp >= -10)
            {
                // denormal half-precision
                unsigned short sig = (significand | 0x800000) >> (14 - newexp);
                fp16 = (sign << 15) | (0x00 << 10) | sig;
            }
            else
            {
                // underflow
                fp16 = (sign << 15) | (0x00 << 10) | 0x00;
            }
        }
        else
        {
            fp16 = (sign << 15) | (newexp << 10) | (significand >> 13);
        }
    }

    return fp16;
}